

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullseq.c
# Opt level: O3

void show_usage(int status)

{
  fwrite("pullseq - a bioinformatics tool for manipulating fasta and fastq files\n",0x47,1,_stderr);
  fprintf(_stderr,"\nVersion: %s              Name lookup method: %s","1.0.2","UTHASH");
  fwrite("\n(Written by bct - copyright 2012-2015)\n",0x28,1,_stderr);
  fwrite("\nUsage:\n",8,1,_stderr);
  fprintf(_stderr," %s -i <input fasta/fastq file> -n <header names to select>\n\n",progname);
  fprintf(_stderr," %s -i <input fasta/fastq file> -m <minimum sequence length>\n\n",progname);
  fprintf(_stderr," %s -i <input fasta/fastq file> -g <regex name to match>\n\n",progname);
  fprintf(_stderr,
          " %s -i <input fasta/fastq file> -m <minimum sequence length> -a <max sequence length>\n\n"
          ,progname);
  fprintf(_stderr," %s -i <input fasta/fastq file> -t\n\n",progname);
  fprintf(_stderr," cat <names to select from STDIN> | %s -i <input fasta/fastq file> -N\n\n",
          progname);
  fwrite("  Options:\n",0xb,1,_stderr);
  fwrite("    -i, --input,       Input fasta/fastq file (required)\n",0x39,1,_stderr);
  fwrite("    -n, --names,       File of header id names to search for\n",0x3d,1,_stderr);
  fwrite("    -N, --names_stdin, Use STDIN for header id names\n",0x35,1,_stderr);
  fwrite("    -g, --regex,       Regular expression to match (PERL compatible; always case-insensitive)\n"
         ,0x5e,1,_stderr);
  fwrite("    -m, --min,         Minimum sequence length\n",0x2f,1,_stderr);
  fwrite("    -a, --max,         Maximum sequence length\n",0x2f,1,_stderr);
  fwrite("    -l, --length,      Sequence characters per line (default 50)\n",0x41,1,_stderr);
  fwrite("    -c, --convert,     Convert input to fastq/fasta (e.g. if input is fastq, output will be fasta)\n"
         ,99,1,_stderr);
  fwrite("    -q, --quality,     ASCII code to use for fasta->fastq quality conversions\n",0x4e,1,
         _stderr);
  fwrite("    -e, --excluded,    Exclude the header id names in the list (-n)\n",0x44,1,_stderr);
  fwrite("    -t, --count,       Just count the possible output, but don\'t write it\n",0x4a,1,
         _stderr);
  fwrite("    -h, --help,        Display this help and exit\n",0x32,1,_stderr);
  fwrite("    -v, --verbose,     Print extra details during the run\n",0x3a,1,_stderr);
  fwrite("    --version,         Output version information and exit\n\n",0x3c,1,_stderr);
  exit(status);
}

Assistant:

void show_usage(int status) {
	fprintf(stderr, "pullseq - a bioinformatics tool for manipulating fasta and fastq files\n");
	fprintf(stderr, "\nVersion: %s              Name lookup method: %s", PULLSEQ_VERSION, PULLSEQ_SORTMETHOD);
	fprintf(stderr, "\n(Written by bct - copyright 2012-2015)\n");
	fprintf(stderr, "\nUsage:\n");
	fprintf(stderr, " %s -i <input fasta/fastq file> -n <header names to select>\n\n", progname);
	fprintf(stderr, " %s -i <input fasta/fastq file> -m <minimum sequence length>\n\n", progname);
	fprintf(stderr, " %s -i <input fasta/fastq file> -g <regex name to match>\n\n", progname);
	fprintf(stderr, " %s -i <input fasta/fastq file> -m <minimum sequence length> -a <max sequence length>\n\n", progname);
	fprintf(stderr, " %s -i <input fasta/fastq file> -t\n\n", progname);
	fprintf(stderr, " cat <names to select from STDIN> | %s -i <input fasta/fastq file> -N\n\n", progname);

	fprintf(stderr, "  Options:\n");
	fprintf(stderr, "    -i, --input,       Input fasta/fastq file (required)\n");
	fprintf(stderr, "    -n, --names,       File of header id names to search for\n");
	fprintf(stderr, "    -N, --names_stdin, Use STDIN for header id names\n");
	fprintf(stderr, "    -g, --regex,       Regular expression to match (PERL compatible; always case-insensitive)\n");
	fprintf(stderr, "    -m, --min,         Minimum sequence length\n");
	fprintf(stderr, "    -a, --max,         Maximum sequence length\n");
	fprintf(stderr, "    -l, --length,      Sequence characters per line (default 50)\n");
	fprintf(stderr, "    -c, --convert,     Convert input to fastq/fasta (e.g. if input is fastq, output will be fasta)\n");
	fprintf(stderr, "    -q, --quality,     ASCII code to use for fasta->fastq quality conversions\n");
	fprintf(stderr, "    -e, --excluded,    Exclude the header id names in the list (-n)\n");
	fprintf(stderr, "    -t, --count,       Just count the possible output, but don't write it\n");
	fprintf(stderr, "    -h, --help,        Display this help and exit\n");
	fprintf(stderr, "    -v, --verbose,     Print extra details during the run\n");
	fprintf(stderr, "    --version,         Output version information and exit\n\n");

	exit(status);
}